

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl.c
# Opt level: O3

int mcpl_actual_can_merge(mcpl_file_t ff1,mcpl_file_t ff2)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  
  iVar7 = 0;
  iVar6 = 0;
  if ((((*(long *)((long)ff1.internal + 0x80) == *(long *)((long)ff2.internal + 0x80)) &&
       (iVar5 = strcmp(*(char **)((long)ff1.internal + 0x10),*(char **)((long)ff2.internal + 0x10)),
       iVar6 = iVar7, iVar5 == 0)) &&
      (*(int *)((long)ff1.internal + 0x1c) == *(int *)((long)ff2.internal + 0x1c))) &&
     (((*(int *)((long)ff1.internal + 0x20) == *(int *)((long)ff2.internal + 0x20) &&
       (*(int *)((long)ff1.internal + 0x24) == *(int *)((long)ff2.internal + 0x24))) &&
      (*(int *)((long)ff1.internal + 0x28) == *(int *)((long)ff2.internal + 0x28))))) {
    if (((*(double *)((long)ff1.internal + 0x30) == *(double *)((long)ff2.internal + 0x30)) &&
        (!NAN(*(double *)((long)ff1.internal + 0x30)) &&
         !NAN(*(double *)((long)ff2.internal + 0x30)))) &&
       ((*(int *)((long)ff1.internal + 0x38) == *(int *)((long)ff2.internal + 0x38) &&
        (((*(int *)((long)ff1.internal + 0x78) == *(int *)((long)ff2.internal + 0x78) &&
          (uVar1 = *(uint *)((long)ff1.internal + 0x48),
          uVar1 == *(uint *)((long)ff2.internal + 0x48))) &&
         (uVar2 = *(uint *)((long)ff1.internal + 0x58),
         uVar2 == *(uint *)((long)ff2.internal + 0x58))))))) {
      if ((ulong)uVar1 != 0) {
        lVar3 = *(long *)((long)ff1.internal + 0x50);
        lVar4 = *(long *)((long)ff2.internal + 0x50);
        uVar8 = 0;
        do {
          iVar6 = strcmp(*(char **)(lVar3 + uVar8 * 8),*(char **)(lVar4 + uVar8 * 8));
          if (iVar6 != 0) {
            return 0;
          }
          uVar8 = uVar8 + 1;
        } while (uVar1 != uVar8);
      }
      iVar6 = 1;
      if ((ulong)uVar2 != 0) {
        lVar3 = *(long *)((long)ff1.internal + 0x68);
        lVar4 = *(long *)((long)ff2.internal + 0x68);
        uVar8 = 0;
        do {
          uVar1 = *(uint *)(lVar3 + uVar8 * 4);
          if (((uVar1 != *(uint *)(lVar4 + uVar8 * 4)) ||
              (iVar7 = strcmp(*(char **)(*(long *)((long)ff1.internal + 0x60) + uVar8 * 8),
                              *(char **)(*(long *)((long)ff2.internal + 0x60) + uVar8 * 8)),
              iVar7 != 0)) ||
             (iVar7 = bcmp(*(void **)(*(long *)((long)ff1.internal + 0x70) + uVar8 * 8),
                           *(void **)(*(long *)((long)ff2.internal + 0x70) + uVar8 * 8),(ulong)uVar1
                          ), iVar7 != 0)) {
            return 0;
          }
          uVar8 = uVar8 + 1;
        } while (uVar2 != uVar8);
      }
    }
  }
  return iVar6;
}

Assistant:

MCPL_LOCAL int mcpl_actual_can_merge(mcpl_file_t ff1, mcpl_file_t ff2)
{
  mcpl_fileinternal_t * f1 = (mcpl_fileinternal_t *)ff1.internal;
  mcpl_fileinternal_t * f2 = (mcpl_fileinternal_t *)ff2.internal;
  assert(f1);
  assert(f2);
  if (f1->first_particle_pos!=f2->first_particle_pos)
    return 0;//different header

  //Note, we do not check the format_version field here, since mcpl_merge_files
  //can actually work on files with different versions.

  //Very strict checking of everything except nparticles. Even order of blobs
  //and comments must be preserved (could possibly be relaxed a bit):
  if (strcmp(f1->hdr_srcprogname,f2->hdr_srcprogname)!=0) return 0;
  if (f1->opt_userflags!=f2->opt_userflags) return 0;
  if (f1->opt_polarisation!=f2->opt_polarisation) return 0;
  if (f1->opt_singleprec!=f2->opt_singleprec) return 0;
  if (f1->opt_universalpdgcode!=f2->opt_universalpdgcode) return 0;
  if (f1->opt_universalweight!=f2->opt_universalweight) return 0;
  if (f1->is_little_endian!=f2->is_little_endian) return 0;
  if (f1->particle_size!=f2->particle_size) return 0;
  if (f1->ncomments!=f2->ncomments) return 0;
  if (f1->nblobs!=f2->nblobs) return 0;
  uint32_t i;
  for (i = 0; i<f1->ncomments; ++i) {
    if (strcmp(f1->comments[i],f2->comments[i])!=0) return 0;
  }
  for (i = 0; i<f1->nblobs; ++i) {
    if (f1->bloblengths[i]!=f2->bloblengths[i]) return 0;
    if (strcmp(f1->blobkeys[i],f2->blobkeys[i])!=0) return 0;
    if (memcmp(f1->blobs[i],f2->blobs[i],f1->bloblengths[i])!=0) return 0;
  }
  return 1;
}